

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O2

QRectF * __thiscall QRectF::operator&(QRectF *this,QRectF *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  QRectF *in_RDI;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar1 = this->w;
  dVar2 = this->xp;
  dVar11 = dVar2 + dVar1;
  dVar7 = dVar11;
  if (0.0 <= dVar1) {
    dVar7 = dVar2;
  }
  if ((dVar11 != dVar2) || (NAN(dVar11) || NAN(dVar2))) {
    dVar3 = r->w;
    dVar13 = r->xp;
    dVar12 = dVar13 + dVar3;
    dVar5 = dVar12;
    if (0.0 <= dVar3) {
      dVar5 = dVar13;
    }
    if ((((dVar12 != dVar13) || (NAN(dVar12) || NAN(dVar13))) &&
        (dVar3 = (double)(~-(ulong)(dVar3 < 0.0) & (ulong)dVar12 |
                         (ulong)dVar13 & -(ulong)(dVar3 < 0.0)), dVar7 < dVar3)) &&
       (auVar6._0_8_ = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar11 |
                               (ulong)dVar2 & -(ulong)(dVar1 < 0.0)), dVar5 < auVar6._0_8_)) {
      dVar1 = this->h;
      dVar2 = this->yp;
      dVar13 = dVar2 + dVar1;
      dVar11 = dVar13;
      if (0.0 <= dVar1) {
        dVar11 = dVar2;
      }
      if ((dVar13 != dVar2) || (NAN(dVar13) || NAN(dVar2))) {
        dVar12 = r->h;
        dVar4 = r->yp;
        dVar15 = dVar4 + dVar12;
        dVar14 = dVar15;
        if (0.0 <= dVar12) {
          dVar14 = dVar4;
        }
        if (((dVar15 != dVar4) || (NAN(dVar15) || NAN(dVar4))) &&
           ((dVar12 = (double)(~-(ulong)(dVar12 < 0.0) & (ulong)dVar15 |
                              (ulong)dVar4 & -(ulong)(dVar12 < 0.0)), dVar11 < dVar12 &&
            (dVar1 = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar13 |
                             (ulong)dVar2 & -(ulong)(dVar1 < 0.0)), dVar14 < dVar1)))) {
          auVar9._8_8_ = dVar14;
          auVar9._0_8_ = dVar5;
          auVar10._8_8_ = dVar11;
          auVar10._0_8_ = dVar7;
          auVar10 = maxpd(auVar9,auVar10);
          auVar6._8_8_ = dVar1;
          auVar8._8_8_ = dVar12;
          auVar8._0_8_ = dVar3;
          auVar6 = minpd(auVar6,auVar8);
          in_RDI->xp = (qreal)auVar10._0_8_;
          in_RDI->yp = (qreal)auVar10._8_8_;
          in_RDI->w = auVar6._0_8_ - auVar10._0_8_;
          in_RDI->h = auVar6._8_8_ - auVar10._8_8_;
          return in_RDI;
        }
      }
    }
  }
  in_RDI->w = 0.0;
  in_RDI->h = 0.0;
  in_RDI->xp = 0.0;
  in_RDI->yp = 0.0;
  return in_RDI;
}

Assistant:

QRectF QRectF::operator&(const QRectF &r) const noexcept
{
    qreal l1 = xp;
    qreal r1 = xp;
    if (w < 0)
        l1 += w;
    else
        r1 += w;
    if (l1 == r1) // null rect
        return QRectF();

    qreal l2 = r.xp;
    qreal r2 = r.xp;
    if (r.w < 0)
        l2 += r.w;
    else
        r2 += r.w;
    if (l2 == r2) // null rect
        return QRectF();

    if (l1 >= r2 || l2 >= r1)
        return QRectF();

    qreal t1 = yp;
    qreal b1 = yp;
    if (h < 0)
        t1 += h;
    else
        b1 += h;
    if (t1 == b1) // null rect
        return QRectF();

    qreal t2 = r.yp;
    qreal b2 = r.yp;
    if (r.h < 0)
        t2 += r.h;
    else
        b2 += r.h;
    if (t2 == b2) // null rect
        return QRectF();

    if (t1 >= b2 || t2 >= b1)
        return QRectF();

    QRectF tmp;
    tmp.xp = qMax(l1, l2);
    tmp.yp = qMax(t1, t2);
    tmp.w = qMin(r1, r2) - tmp.xp;
    tmp.h = qMin(b1, b2) - tmp.yp;
    return tmp;
}